

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::Identify(string *distinct_id,bool is_login_id)

{
  __type _Var1;
  bool is_login_id_local;
  string *distinct_id_local;
  
  if ((instance_ != 0) &&
     ((is_login_id != (bool)(*(byte *)(instance_ + 0x28) & 1) ||
      (_Var1 = std::operator==(distinct_id,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (instance_ + 8)), !_Var1)))) {
    std::__cxx11::string::operator=((string *)(instance_ + 8),(string *)distinct_id);
    *(bool *)(instance_ + 0x28) = is_login_id;
    Notify();
  }
  return;
}

Assistant:

void Sdk::Identify(const string &distinct_id, bool is_login_id) {
  if (instance_) {
      // 当登录状态和 distinct_id 都未发生变化时，不更新 distinct_id 和 is_login_id
      if (is_login_id == instance_->is_login_id_ && distinct_id == instance_->distinct_id_) {
          return;
      }

    instance_->distinct_id_ = distinct_id;
    instance_->is_login_id_ = is_login_id;
    instance_->Notify();
  }
}